

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Vec3fa embree::VelvetMaterial__eval
                 (ISPCVelvetMaterial *This,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,Vec3fa *wi
                 )

{
  long in_RSI;
  Velvety *in_RDI;
  Vec3fa VVar1;
  Velvety velvety;
  Minneart minneart;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d8;
  Vec3fa *in_stack_fffffffffffffe38;
  DifferentialGeometry *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  Minneart local_c8 [2];
  long local_80;
  undefined8 *local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_50;
  undefined8 *local_48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  local_80 = in_RSI;
  Minneart::Minneart(local_c8);
  local_58 = (undefined8 *)(local_80 + 0x10);
  local_50 = &local_d8;
  local_d8._0_8_ = *local_58;
  local_d8._8_8_ = *(undefined8 *)(local_80 + 0x18);
  Minneart__Constructor(local_c8,(Vec3fa *)&local_d8.field_1,*(float *)(local_80 + 0x30));
  Velvety::Velvety(in_RDI);
  local_48 = (undefined8 *)(local_80 + 0x20);
  local_40 = &local_1d8;
  local_1d8._0_8_ = *local_48;
  local_1d8._8_8_ = *(undefined8 *)(local_80 + 0x28);
  Velvety__Constructor
            ((Velvety *)&stack0xfffffffffffffe38,(Vec3fa *)&local_1d8.field_1,
             *(float *)(local_80 + 0x34));
  Minneart__eval((Minneart *)in_stack_fffffffffffffe50,(Vec3fa *)in_stack_fffffffffffffe48,
                 in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  Velvety__eval((Velvety *)in_stack_fffffffffffffe50,(Vec3fa *)in_stack_fffffffffffffe48,
                in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_28 = (float)local_1e8;
  fStack_24 = (float)((ulong)local_1e8 >> 0x20);
  fStack_20 = (float)uStack_1e0;
  fStack_1c = (float)((ulong)uStack_1e0 >> 0x20);
  local_38 = (float)local_1f8;
  fStack_34 = (float)((ulong)local_1f8 >> 0x20);
  fStack_30 = (float)uStack_1f0;
  fStack_2c = (float)((ulong)uStack_1f0 >> 0x20);
  VVar1.field_0._0_4_ = local_28 + local_38;
  VVar1.field_0._4_4_ = fStack_24 + fStack_34;
  (in_RDI->base).Ns = VVar1.field_0._0_4_;
  (in_RDI->base).Ni = VVar1.field_0._4_4_;
  *(ulong *)&(in_RDI->base).field_0x8 = CONCAT44(fStack_1c + fStack_2c,fStack_20 + fStack_30);
  VVar1.field_0._8_8_ = local_1e8;
  return (Vec3fa)VVar1.field_0;
}

Assistant:

Vec3fa VelvetMaterial__eval(ISPCVelvetMaterial* This, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  Minneart minneart; Minneart__Constructor(&minneart,(Vec3fa)Vec3fa(This->reflectance),This->backScattering);
  Velvety velvety; Velvety__Constructor (&velvety,Vec3fa((Vec3fa)This->horizonScatteringColor),This->horizonScatteringFallOff);
  return Minneart__eval(&minneart,wo,dg,wi) + Velvety__eval(&velvety,wo,dg,wi);
}